

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O0

Matrix<float,_3,_3> * __thiscall
vkt::sr::(anonymous_namespace)::MatrixCaseUtils::decrement<float,3,3>
          (Matrix<float,_3,_3> *__return_storage_ptr__,MatrixCaseUtils *this,
          Matrix<float,_3,_3> *mat)

{
  float fVar1;
  float *pfVar2;
  undefined4 local_24;
  undefined4 local_20;
  int c;
  int r;
  Matrix<float,_3,_3> *mat_local;
  Matrix<float,_3,_3> *retVal;
  
  tcu::Matrix<float,_3,_3>::Matrix(__return_storage_ptr__);
  for (local_20 = 0; local_20 < 3; local_20 = local_20 + 1) {
    for (local_24 = 0; local_24 < 3; local_24 = local_24 + 1) {
      pfVar2 = tcu::Matrix<float,_3,_3>::operator()((Matrix<float,_3,_3> *)this,local_20,local_24);
      fVar1 = *pfVar2;
      pfVar2 = tcu::Matrix<float,_3,_3>::operator()(__return_storage_ptr__,local_20,local_24);
      *pfVar2 = fVar1 + -1.0;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::Matrix<T, Rows, Cols> decrement (const tcu::Matrix<T, Rows, Cols>& mat)
{
	tcu::Matrix<T, Rows, Cols> retVal;

	for (int r = 0; r < Rows; ++r)
		for (int c = 0; c < Cols; ++c)
			retVal(r,c) = mat(r, c) - 1.0f;

	return retVal;
}